

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Draw.cpp
# Opt level: O0

void anon_unknown.dwarf_1485b::DeferredCircle::addToBuffer
               (float radius,Vec3 *axis,Vec3 *center,Color *color,int segments,bool filled,bool in3d
               )

{
  undefined4 in_ECX;
  value_type *in_RDX;
  Vec3 *in_RSI;
  Vec3 *in_RDI;
  undefined4 in_R8D;
  byte in_R9B;
  DeferredCircle dc;
  Vec3 local_58;
  Vec3 local_4c;
  undefined8 local_40;
  undefined8 local_38;
  undefined4 local_30;
  byte local_2c;
  byte local_2b;
  byte local_26;
  byte local_25;
  undefined4 local_24;
  value_type *local_20;
  Vec3 *local_18;
  Vec3 *local_10;
  
  local_25 = (byte)in_R8D & 1;
  local_26 = in_R9B & 1;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  DeferredCircle((DeferredCircle *)CONCAT44(in_ECX,in_R8D));
  OpenSteer::Vec3::operator=(&local_58,local_10);
  OpenSteer::Vec3::operator=(&local_4c,local_18);
  local_40._0_4_ = local_20->radius;
  local_40._4_4_ = (local_20->axis).x;
  local_38._0_4_ = (local_20->axis).y;
  local_38._4_4_ = (local_20->axis).z;
  local_30 = local_24;
  local_2c = local_25 & 1;
  local_2b = local_26 & 1;
  std::
  vector<(anonymous_namespace)::DeferredCircle,_std::allocator<(anonymous_namespace)::DeferredCircle>_>
  ::push_back((vector<(anonymous_namespace)::DeferredCircle,_std::allocator<(anonymous_namespace)::DeferredCircle>_>
               *)in_RSI,in_RDX);
  return;
}

Assistant:

static void addToBuffer (const float radius,
                                 const OpenSteer::Vec3& axis,
                                 const OpenSteer::Vec3& center,
                                 const OpenSteer::Color& color,
                                 const int segments,
                                 const bool filled,
                                 const bool in3d)
        {
            DeferredCircle dc;
            dc.radius   = radius;
            dc.axis     = axis;
            dc.center   = center;
            dc.color    = color;
            dc.segments = segments;
            dc.filled   = filled;
            dc.in3d     = in3d;
            circles.push_back (dc);
        }